

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

int __thiscall amrex::ParmParse::query(ParmParse *this,char *name,double *ptr,int ival)

{
  Table *table;
  bool bVar1;
  allocator local_69;
  string local_68;
  string local_48;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_48,name,&local_69);
  prefixedName(&local_68,this,&local_48);
  bVar1 = anon_unknown_12::anon_unknown_0::squeryval<double>(table,&local_68,ptr,ival,-1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return (uint)bVar1;
}

Assistant:

int
ParmParse::query (const char* name,
                  double&     ptr,
                  int         ival) const
{
    return squeryval(m_table, prefixedName(name),ptr,ival, LAST);
}